

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogButtons(void)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool log_to_clipboard;
  bool log_to_file;
  bool log_to_tty;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  undefined7 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar4;
  float in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  
  PushID((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffec,0.0,0.0);
  bVar1 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  bVar2 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  uVar4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffe8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,0.0,0.0);
  bVar3 = Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  PushAllowKeyboardFocus(false);
  SetNextItemWidth(80.0);
  SliderInt((char *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
            (int *)CONCAT44(in_stack_ffffffffffffffec,uVar4),(int)in_stack_ffffffffffffffe4,
            (int)in_stack_ffffffffffffffe0,(char *)CONCAT17(bVar3,in_stack_ffffffffffffffd8),
            (ImGuiSliderFlags)in_stack_ffffffffffffffd4);
  PopAllowKeyboardFocus();
  PopID();
  if ((bVar1 & 1) != 0) {
    LogToTTY((int)in_stack_ffffffffffffffd4);
  }
  if ((uVar4 & 0x1000000) != 0) {
    LogToFile((int)in_stack_ffffffffffffffe4,(char *)CONCAT17(bVar3,in_stack_ffffffffffffffd8));
  }
  if ((bVar3 & 1) != 0) {
    LogToClipboard((int)in_stack_ffffffffffffffd4);
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}